

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int secp_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  EC_GROUP *group;
  BN_CTX *bn_ctx;
  EC_POINT *pub_key;
  EC_KEY *key;
  EC_POINT *point;
  uint8_t *out;
  int iVar4;
  size_t __size;
  ptls_iovec_t pVar5;
  
  group = EC_GROUP_new_by_curve_name((int)algo->data);
  if (group == (EC_GROUP *)0x0) {
    iVar4 = 0x203;
  }
  else {
    bn_ctx = BN_CTX_new();
    if (bn_ctx != (BN_CTX *)0x0) {
      pubkey->base = (uint8_t *)0x0;
      pubkey->len = 0;
      secret->base = (uint8_t *)0x0;
      secret->len = 0;
      pub_key = x9_62_decode_point((EC_GROUP *)group,peerkey,(BN_CTX *)bn_ctx);
      if (pub_key == (EC_POINT *)0x0) {
        iVar4 = 0x32;
LAB_00106b49:
        bVar1 = false;
        key = (EC_KEY *)0x0;
      }
      else {
        key = ecdh_gerenate_key((EC_GROUP *)group);
        iVar4 = 0x201;
        if (key == (EC_KEY *)0x0) goto LAB_00106b49;
        point = EC_KEY_get0_public_key((EC_KEY *)key);
        pVar5 = x9_62_encode_point((EC_GROUP *)group,(EC_POINT *)point,(BN_CTX *)bn_ctx);
        *pubkey = pVar5;
        if (pVar5.base == (uint8_t *)0x0) {
          bVar1 = false;
        }
        else {
          iVar2 = EC_GROUP_get_degree(group);
          iVar3 = iVar2 + 0xe;
          if (-1 < iVar2 + 7) {
            iVar3 = iVar2 + 7;
          }
          __size = (size_t)(iVar3 >> 3);
          secret->len = __size;
          out = (uint8_t *)malloc(__size);
          secret->base = out;
          bVar1 = false;
          if (out != (uint8_t *)0x0) {
            iVar3 = ECDH_compute_key(out,__size,(EC_POINT *)pub_key,(EC_KEY *)key,(KDF *)0x0);
            iVar4 = 0x28;
            if (0 < iVar3) {
              iVar4 = 0;
            }
            bVar1 = 0 < iVar3;
          }
        }
      }
      if (pub_key != (EC_POINT *)0x0) {
        EC_POINT_free((EC_POINT *)pub_key);
      }
      if (key != (EC_KEY *)0x0) {
        EC_KEY_free((EC_KEY *)key);
      }
      if (!bVar1) {
        free(pubkey->base);
        pubkey->base = (uint8_t *)0x0;
        pubkey->len = 0;
        free(secret->base);
        secret->base = (uint8_t *)0x0;
        secret->len = 0;
      }
      goto LAB_00106b9d;
    }
    iVar4 = 0x201;
  }
  bn_ctx = (BN_CTX *)0x0;
LAB_00106b9d:
  if (bn_ctx != (BN_CTX *)0x0) {
    BN_CTX_free(bn_ctx);
  }
  if (group != (EC_GROUP *)0x0) {
    EC_GROUP_free(group);
  }
  return iVar4;
}

Assistant:

static int secp_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    EC_GROUP *group = NULL;
    BN_CTX *bn_ctx = NULL;
    int ret;

    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((bn_ctx = BN_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = x9_62_key_exchange(group, pubkey, secret, peerkey, bn_ctx);

Exit:
    if (bn_ctx != NULL)
        BN_CTX_free(bn_ctx);
    if (group != NULL)
        EC_GROUP_free(group);
    return ret;
}